

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O0

bool __thiscall
Lowerer::LinkCtorCacheToGuardedProperties(Lowerer *this,JITTimeConstructorCache *ctorCache)

{
  anon_class_16_2_8424be3b link;
  bool bVar1;
  BVSparse<Memory::JitArenaAllocator> *pBVar2;
  JITTimeWorkItem *this_00;
  FunctionJITTimeInfo *this_01;
  bool local_21;
  bool linked;
  JITTimeConstructorCache *ctorCache_local;
  Lowerer *this_local;
  
  pBVar2 = JITTimeConstructorCache::GetGuardedPropOps(ctorCache);
  if (pBVar2 == (BVSparse<Memory::JitArenaAllocator> *)0x0) {
    this_local._7_1_ = false;
  }
  else {
    local_21 = false;
    this_00 = Func::GetWorkItem(this->m_func);
    this_01 = JITTimeWorkItem::GetJITTimeInfo(this_00);
    bVar1 = FunctionJITTimeInfo::HasSharedPropertyGuards(this_01);
    if (bVar1) {
      pBVar2 = JITTimeConstructorCache::GetGuardedPropOps(ctorCache);
      link.ctorCache = ctorCache;
      link.this = this;
      local_21 = LinkGuardToGuardedProperties<Lowerer::LinkCtorCacheToGuardedProperties(JITTimeConstructorCache*)::__0>
                           (this,pBVar2,link);
    }
    this_local._7_1_ = local_21;
  }
  return this_local._7_1_;
}

Assistant:

bool
Lowerer::LinkCtorCacheToGuardedProperties(JITTimeConstructorCache* ctorCache)
{
    // We do not always have guarded properties. If the constructor is empty and the subsequent code doesn't load or store any of
    // the constructed object's properties, or if all inline caches are empty then this ctor cache doesn't guard any properties.
    if (ctorCache->GetGuardedPropOps() == nullptr)
    {
        return false;
    }

    bool linked = false;

    if (this->m_func->GetWorkItem()->GetJITTimeInfo()->HasSharedPropertyGuards())
    {
        linked = LinkGuardToGuardedProperties(ctorCache->GetGuardedPropOps(), [=](Js::PropertyId propertyId)
        {
            if (PHASE_TRACE(Js::ObjTypeSpecPhase, this->m_func) || PHASE_TRACE(Js::TracePropertyGuardsPhase, this->m_func))
            {
                char16 debugStringBuffer[MAX_FUNCTION_BODY_DEBUG_STRING_SIZE];
                Output::Print(_u("ObjTypeSpec: function %s(%s) registered ctor cache 0x%p with value 0x%p for property %u.\n"),
                    this->m_func->GetJITFunctionBody()->GetDisplayName(), this->m_func->GetDebugNumberSet(debugStringBuffer),
                    ctorCache->GetRuntimeCacheAddr(), ctorCache->GetType()->GetAddr(), propertyId);
                Output::Flush();
            }

            this->m_func->EnsureCtorCachesByPropertyId();
            this->m_func->LinkCtorCacheToPropertyId(propertyId, ctorCache);
        });
    }
    return linked;
}